

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# puppet.hpp
# Opt level: O2

_func_void_void_ptr_void_ptr * __thiscall
__henson__Puppet__get_function<void(*)(void*,void*)>_void__char_const___
          (void *this,void *lib,char *name)

{
  _func_void_void_ptr_void_ptr *p_Var1;
  runtime_error *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v8::basic_format_context<fmt::v8::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string sStack_78;
  char *local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  p_Var1 = (_func_void_void_ptr_void_ptr *)dlsym(lib,name);
  if (p_Var1 != (_func_void_void_ptr_void_ptr *)0x0) {
    return p_Var1;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_38 = dlerror();
  local_48 = *(undefined8 *)((long)this + 0x70);
  uStack_40 = *(undefined8 *)((long)this + 0x78);
  fmt.size_ = 0xcdc;
  fmt.data_ = (char *)0x1d;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)local_58;
  local_58[0] = name;
  ::fmt::v8::vformat_abi_cxx11_(&sStack_78,(v8 *)"Could not load {}() in {}\n{}\n",fmt,args);
  std::runtime_error::runtime_error(this_00,(string *)&sStack_78);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

T                   get_function(void* lib, const char* name)
    {
        T f = (T) dlsym(lib, name);
        if (f == NULL)
            throw std::runtime_error(fmt::format("Could not load {}() in {}\n{}\n", name, filename_, dlerror()));
        return f;
    }